

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void __thiscall Benchmark<ClockRecovery>::fillQueue(Benchmark<ClockRecovery> *this)

{
  _Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
  local_20;
  undefined8 local_18;
  
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForWrite
            ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
             &stack0xffffffffffffffe8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::resize
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_18,
             (long)this->blockSize_);
  local_20._M_head_impl =
       (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_18;
  local_18 = (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)0x0;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushWrite
            ((this->inQueue_).
             super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,(unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                      *)&local_20);
  if (local_20._M_head_impl !=
      (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)0x0) {
    std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::
    operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                *)&local_20,local_20._M_head_impl);
  }
  local_20._M_head_impl = (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)0x0;
  if ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_18 !=
      (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)0x0) {
    std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::
    operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                *)&stack0xffffffffffffffe8,
               (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_18);
  }
  return;
}

Assistant:

void fillQueue() {
    auto input = inQueue_->popForWrite();
    input->resize(blockSize_);
    inQueue_->pushWrite(std::move(input));
  }